

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderToolsCommon.hpp
# Opt level: O0

size_t __thiscall
Diligent::ShaderCodeVariableDescX::AddMember
          (ShaderCodeVariableDescX *this,ShaderCodeVariableDesc *Member)

{
  size_type sVar1;
  size_type sVar2;
  ShaderCodeVariableDescX *pSVar3;
  size_type idx;
  ShaderCodeVariableDesc *Member_local;
  ShaderCodeVariableDescX *this_local;
  
  sVar1 = std::
          vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
          ::size(&this->Members);
  std::vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>::
  emplace_back<Diligent::ShaderCodeVariableDesc_const&>
            ((vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>
              *)&this->Members,Member);
  sVar2 = std::
          vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
          ::size(&this->Members);
  (this->super_ShaderCodeVariableDesc).NumMembers = (Uint32)sVar2;
  pSVar3 = std::
           vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
           ::data(&this->Members);
  (this->super_ShaderCodeVariableDesc).pMembers = &pSVar3->super_ShaderCodeVariableDesc;
  return sVar1;
}

Assistant:

size_t AddMember(const ShaderCodeVariableDesc& Member)
    {
        const auto idx = Members.size();
        Members.emplace_back(Member);
        NumMembers = static_cast<Uint32>(Members.size());
        pMembers   = Members.data();
        return idx;
    }